

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

void __thiscall llama_model_loader::load_data_for(llama_model_loader *this,ggml_tensor *cur)

{
  ggml_type gVar1;
  pointer puVar2;
  void *pvVar3;
  pointer puVar4;
  __uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_> this_00;
  char cVar5;
  char *pcVar6;
  llama_tensor_weight *plVar7;
  void *pvVar8;
  size_t __n;
  size_t len;
  undefined8 uVar9;
  runtime_error *this_01;
  ulong uVar10;
  string local_50;
  
  pcVar6 = (char *)ggml_get_name(cur);
  plVar7 = require_weight(this,pcVar6);
  if (this->use_mmap == true) {
    puVar2 = (this->mappings).
             super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mappings).
                      super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <=
        (ulong)plVar7->idx) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    pvVar3 = cur->data;
    pvVar8 = llama_mmap::addr((llama_mmap *)
                              puVar2[plVar7->idx]._M_t.
                              super___uniq_ptr_impl<llama_mmap,_std::default_delete<llama_mmap>_>.
                              _M_t);
    pvVar8 = (void *)((long)pvVar8 + plVar7->offs);
    if (pvVar3 == (void *)0x0) {
      cur->data = pvVar8;
    }
    else {
      __n = ggml_nbytes(cur);
      memcpy(pvVar3,pvVar8,__n);
    }
LAB_001b6a08:
    if (this->check_tensors == true) {
      gVar1 = cur->type;
      pvVar3 = cur->data;
      uVar9 = ggml_nbytes(cur);
      cVar5 = ggml_validate_row_data(gVar1,pvVar3,uVar9);
      if (cVar5 == '\0') {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        uVar9 = ggml_get_name(cur);
        format_abi_cxx11_(&local_50,"tensor \'%s\' has invalid data",uVar9);
        std::runtime_error::runtime_error(this_01,(string *)&local_50);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    return;
  }
  if (cur->data == (void *)0x0) {
    pcVar6 = "cur->data != nullptr";
    uVar9 = 0x368;
  }
  else {
    uVar10 = (ulong)plVar7->idx;
    puVar4 = (this->files).
             super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar10 < (ulong)((long)(this->files).
                               super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3)) {
      llama_file::seek((llama_file *)
                       puVar4[uVar10]._M_t.
                       super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t,
                       plVar7->offs,0);
      this_00._M_t.super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
      super__Head_base<0UL,_llama_file_*,_false>._M_head_impl =
           puVar4[uVar10]._M_t.super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>.
           _M_t;
      pvVar3 = cur->data;
      len = ggml_nbytes(cur);
      llama_file::read_raw
                ((llama_file *)
                 this_00._M_t.super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>
                 .super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,pvVar3,len);
      goto LAB_001b6a08;
    }
    pcVar6 = "w.idx < files.size()";
    uVar9 = 0x369;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
             ,uVar9,"GGML_ASSERT(%s) failed",pcVar6);
}

Assistant:

void llama_model_loader::load_data_for(struct ggml_tensor * cur) const {
    const auto & w = require_weight(ggml_get_name(cur));

    if (use_mmap) {
        const auto & mapping = mappings.at(w.idx);
        if (cur->data == nullptr) {
            cur->data = (uint8_t *)mapping->addr() + w.offs;
        } else {
            memcpy(cur->data, (uint8_t *)mapping->addr() + w.offs, ggml_nbytes(cur));
        }
    } else {
        GGML_ASSERT(cur->data != nullptr);
        GGML_ASSERT(w.idx < files.size());
        const auto & file = files.at(w.idx);
        file->seek(w.offs, SEEK_SET);
        file->read_raw(cur->data, ggml_nbytes(cur));
    }

    if (check_tensors && !ggml_validate_row_data(cur->type, cur->data, ggml_nbytes(cur))) {
        throw std::runtime_error(format("tensor '%s' has invalid data", ggml_get_name(cur)));
    }
}